

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_verify_face_manifold(REF_CAVITY ref_cavity)

{
  int node1;
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  REF_INT found_face;
  int local_2c;
  
  if ((ref_cavity->state != REF_CAVITY_INCONSISTENT) && (iVar1 = ref_cavity->maxface, 0 < iVar1)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      node1 = *(int *)((long)ref_cavity->f2n + lVar5);
      if (node1 != -1) {
        ref_cavity_find_face_with_side
                  (ref_cavity,*(REF_INT *)((long)ref_cavity->f2n + lVar5 + 4),node1,&local_2c);
        if (ref_cavity->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (local_2c == -1) {
          pcVar3 = "side 01 missing";
          uVar2 = 0x1dc;
LAB_0011326b:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar2,"ref_cavity_verify_face_manifold",pcVar3);
          return 1;
        }
        ref_cavity_find_face_with_side
                  (ref_cavity,*(REF_INT *)((long)ref_cavity->f2n + lVar5 + 8),
                   *(REF_INT *)((long)ref_cavity->f2n + lVar5 + 4),&local_2c);
        if (ref_cavity->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (local_2c == -1) {
          pcVar3 = "side 12 missing";
          uVar2 = 0x1e3;
          goto LAB_0011326b;
        }
        ref_cavity_find_face_with_side
                  (ref_cavity,*(REF_INT *)((long)ref_cavity->f2n + lVar5),
                   *(REF_INT *)((long)ref_cavity->f2n + lVar5 + 8),&local_2c);
        if (ref_cavity->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (local_2c == -1) {
          pcVar3 = "side 20 missing";
          uVar2 = 0x1ea;
          goto LAB_0011326b;
        }
        iVar1 = ref_cavity->maxface;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar4 < iVar1);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_verify_face_manifold(
    REF_CAVITY ref_cavity) {
  REF_INT face, found_face;

  if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
    return REF_SUCCESS;

  each_ref_cavity_valid_face(ref_cavity, face) {
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 1, face),
            ref_cavity_f2n(ref_cavity, 0, face), &found_face),
        "find side 01");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 01 missing");
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 2, face),
            ref_cavity_f2n(ref_cavity, 1, face), &found_face),
        "find side 12");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 12 missing");
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 0, face),
            ref_cavity_f2n(ref_cavity, 2, face), &found_face),
        "find side 20");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 20 missing");
  }

  return REF_SUCCESS;
}